

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

HANDLE GetStdHandle(DWORD nStdHandle)

{
  void *pvVar1;
  int *piVar2;
  undefined1 *puVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    pvVar1 = pthread_getspecific(CorUnix::thObjKey);
    if (pvVar1 == (void *)0x0) {
      CreateCurrentThreadData();
    }
    puVar3 = (undefined1 *)pStdErr;
    if (((nStdHandle != 0xfffffff4) && (puVar3 = (undefined1 *)pStdOut, nStdHandle != 0xfffffff5))
       && (puVar3 = (undefined1 *)pStdIn, nStdHandle != 0xfffffff6)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00125968;
      piVar2 = __errno_location();
      *piVar2 = 0x57;
      puVar3 = &DAT_ffffffffffffffff;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return puVar3;
    }
  }
LAB_00125968:
  abort();
}

Assistant:

HANDLE
PALAPI
GetStdHandle(
         IN DWORD nStdHandle)
{
    CPalThread *pThread;
    HANDLE hRet = INVALID_HANDLE_VALUE;

    PERF_ENTRY(GetStdHandle);
    ENTRY("GetStdHandle(nStdHandle=%#x)\n", nStdHandle);

    pThread = InternalGetCurrentThread();
    switch( nStdHandle )
    {
    case STD_INPUT_HANDLE:
        hRet = pStdIn;
        break;
    case STD_OUTPUT_HANDLE:
        hRet = pStdOut;
        break;
    case STD_ERROR_HANDLE:
        hRet = pStdErr; 
        break;
    default:
        ERROR("nStdHandle is invalid\n");
        pThread->SetLastError(ERROR_INVALID_PARAMETER);
        break;
    }

    LOGEXIT("GetStdHandle returns HANDLE %p\n", hRet);
    PERF_EXIT(GetStdHandle);
    return hRet;
}